

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gp3p::sPolynomial19
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  double dVar4;
  double dVar5;
  Index in_stack_fffffffffffffee8;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *in_stack_fffffffffffffef0;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *this;
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0x8bd536);
  row = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_fffffffffffffef0,(Index)row,0x8bd556);
  dVar4 = row / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_fffffffffffffef0,(Index)row,0x8bd57c);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *)*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd59d);
  dVar5 = (double)this / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd5ce);
  *pSVar3 = dVar4 - dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd5ef);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd610);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd637);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd658);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd690);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd6b7);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd6d8);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd6f9);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd720);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd741);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd772);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd793);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd7b4);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd7db);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd7fc);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd834);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd85b);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd87c);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd8a0);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd8cd);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd8f1);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd92c);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd959);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd97d);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd9a1);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd9ce);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bd9f2);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bda2c);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bda50);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bda74);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdaa1);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdac5);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdb00);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdb2d);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdb51);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdb75);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdba2);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdbc6);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdc01);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdc2e);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdc52);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdc76);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8bdca3);
  *pSVar3 = dVar4 / dVar5;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial19( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(19,34) = (groebnerMatrix(10,70)/(groebnerMatrix(10,66))-groebnerMatrix(12,71)/(groebnerMatrix(12,70)));
  groebnerMatrix(19,35) = groebnerMatrix(10,71)/(groebnerMatrix(10,66));
  groebnerMatrix(19,45) = -groebnerMatrix(12,75)/(groebnerMatrix(12,70));
  groebnerMatrix(19,49) = (groebnerMatrix(10,75)/(groebnerMatrix(10,66))-groebnerMatrix(12,76)/(groebnerMatrix(12,70)));
  groebnerMatrix(19,50) = groebnerMatrix(10,76)/(groebnerMatrix(10,66));
  groebnerMatrix(19,54) = -groebnerMatrix(12,77)/(groebnerMatrix(12,70));
  groebnerMatrix(19,55) = groebnerMatrix(10,77)/(groebnerMatrix(10,66));
  groebnerMatrix(19,66) = -groebnerMatrix(12,81)/(groebnerMatrix(12,70));
  groebnerMatrix(19,70) = (groebnerMatrix(10,81)/(groebnerMatrix(10,66))-groebnerMatrix(12,82)/(groebnerMatrix(12,70)));
  groebnerMatrix(19,71) = groebnerMatrix(10,82)/(groebnerMatrix(10,66));
  groebnerMatrix(19,75) = -groebnerMatrix(12,83)/(groebnerMatrix(12,70));
  groebnerMatrix(19,76) = groebnerMatrix(10,83)/(groebnerMatrix(10,66));
  groebnerMatrix(19,81) = -groebnerMatrix(12,84)/(groebnerMatrix(12,70));
  groebnerMatrix(19,82) = groebnerMatrix(10,84)/(groebnerMatrix(10,66));
}